

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O2

void serializeInOutVar(QDataStream *stream,InOutVariable *v,int version)

{
  long lVar1;
  BlockVariable *sv;
  BlockVariable *v_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QString::fromUtf8<void>((QString *)&local_40,&v->name);
  operator<<(stream,(QString *)&local_40);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
  QDataStream::operator<<(stream,v->type);
  serializeDecorations(stream,v,version);
  if (8 < version) {
    QDataStream::operator<<(stream,(int)(v->structMembers).d.size);
    v_00 = (v->structMembers).d.ptr;
    for (lVar1 = (v->structMembers).d.size * 0x68; lVar1 != 0; lVar1 = lVar1 + -0x68) {
      serializeBlockMemberVar(stream,v_00);
      v_00 = v_00 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void serializeInOutVar(QDataStream *stream, const QShaderDescription::InOutVariable &v,
                              int version)
{
    (*stream) << QString::fromUtf8(v.name);
    (*stream) << int(v.type);
    serializeDecorations(stream, v, version);
    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_INPUT_OUTPUT_INTERFACE_BLOCKS) {
        (*stream) << int(v.structMembers.size());
        for (const QShaderDescription::BlockVariable &sv : v.structMembers)
            serializeBlockMemberVar(stream, sv);
    }
}